

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O1

Polygon * iDynTree::Polygon::XYRectangleFromOffsets
                    (Polygon *__return_storage_ptr__,double front,double back,double left,
                    double right)

{
  double dVar1;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ulong in_XMM3_Qb;
  Position local_50 [24];
  double local_38;
  ulong uStack_30;
  undefined1 local_28 [16];
  
  local_28._8_4_ = in_XMM1_Dc;
  local_28._0_8_ = back;
  local_28._12_4_ = in_XMM1_Dd;
  local_38 = right;
  uStack_30 = in_XMM3_Qb;
  Polygon(__return_storage_ptr__);
  iDynTree::Position::Position(local_50,front,left,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::
  emplace_back<iDynTree::Position>(&__return_storage_ptr__->m_vertices,local_50);
  dVar1 = local_28._0_8_;
  local_28._0_8_ = (ulong)dVar1 ^ 0x8000000000000000;
  local_28._12_4_ = local_28._12_4_ ^ 0x80000000;
  iDynTree::Position::Position(local_50,-dVar1,left,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::
  emplace_back<iDynTree::Position>(&__return_storage_ptr__->m_vertices,local_50);
  dVar1 = local_38;
  local_38 = -local_38;
  uStack_30 = uStack_30 ^ 0x8000000000000000;
  iDynTree::Position::Position(local_50,(double)local_28._0_8_,-dVar1,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::
  emplace_back<iDynTree::Position>(&__return_storage_ptr__->m_vertices,local_50);
  iDynTree::Position::Position(local_50,front,local_38,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::
  emplace_back<iDynTree::Position>(&__return_storage_ptr__->m_vertices,local_50);
  return __return_storage_ptr__;
}

Assistant:

Polygon Polygon::XYRectangleFromOffsets(const double front, const double back, const double left, const double right)
    {
        Polygon ret;
        ret.m_vertices.push_back(iDynTree::Position(front,left,0.0));
        ret.m_vertices.push_back(iDynTree::Position(-back,left,0.0));
        ret.m_vertices.push_back(iDynTree::Position(-back,-right,0.0));
        ret.m_vertices.push_back(iDynTree::Position(front,-right,0.0));

        return ret;
    }